

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternModel.cpp
# Opt level: O3

void __thiscall PatternModel::setCursor(PatternModel *this,PatternCursor cursor)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  CursorChangeFlags _t1;
  CursorChangeFlags local_1c;
  
  uVar3 = cursor.super_PatternCursorBase.track;
  local_1c.i = 0;
  if ((this->mPlaying != true) || (this->mFollowing == false)) {
    setCursorRowImpl(this,cursor.super_PatternCursorBase.row,&local_1c);
  }
  setCursorColumnImpl(this,cursor.super_PatternCursorBase.column,&local_1c);
  uVar1 = (this->mCursor).super_PatternCursorBase.track;
  if (uVar1 != uVar3) {
    if (this->mWrapCursor == true) {
      if ((int)uVar3 < 0) {
        uVar2 = 4 - (-uVar3 & 3);
      }
      else {
        uVar2 = uVar3 & 3;
      }
    }
    else {
      uVar4 = 3;
      if (uVar3 < 3) {
        uVar4 = uVar3;
      }
      uVar2 = 0;
      if (-1 < (int)uVar3) {
        uVar2 = uVar4;
      }
    }
    if (uVar2 != uVar1) {
      (this->mCursor).super_PatternCursorBase.track = uVar2;
      _t1.i = local_1c.i | 4;
      goto LAB_0016cae5;
    }
  }
  _t1.i = local_1c.i;
  if (local_1c.i == 0) {
    return;
  }
LAB_0016cae5:
  cursorChanged(this,_t1);
  return;
}

Assistant:

void PatternModel::setCursor(PatternCursor const cursor) {
    CursorChangeFlags flags = CursorUnchanged;
    if (!(mPlaying && mFollowing)) {
        setCursorRowImpl(cursor.row, flags);
    }
    setCursorColumnImpl(cursor.column, flags);
    setCursorTrackImpl(cursor.track, flags);
    emitIfChanged(flags);
}